

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O1

Vec_Wec_t *
Acec_ManCollectCarryRootSets
          (Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vCarryMap,Vec_Int_t *vXors,Vec_Int_t *vXorRoots,
          Vec_Int_t *vCarryRoots)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Bit_t *vIsCarryRoot;
  Vec_Int_t *vXorSet;
  int *piVar7;
  Gia_Man_t *p_01;
  size_t __nmemb;
  Vec_Int_t *pVVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  Gia_Man_t *p_02;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  
  p_00 = (Gia_Man_t *)malloc(0x10);
  p_00->pName = (char *)0x64;
  pVVar5 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pSpec = (char *)pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  uVar1 = p->nObjs;
  iVar13 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  vIsCarryRoot = (Vec_Bit_t *)malloc(0x10);
  vIsCarryRoot->nSize = 0;
  iVar16 = iVar13 * 0x20;
  vIsCarryRoot->nCap = iVar16;
  if (iVar13 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar13 * 4);
  }
  vIsCarryRoot->pArray = piVar6;
  vIsCarryRoot->nSize = iVar16;
  memset(piVar6,0,(long)iVar13 << 2);
  vXorSet = (Vec_Int_t *)malloc(0x10);
  vXorSet->nCap = 100;
  vXorSet->nSize = 0;
  piVar7 = (int *)malloc(400);
  vXorSet->pArray = piVar7;
  p_01 = (Gia_Man_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar9 = uVar1;
  }
  *(int *)((long)&p_01->pName + 4) = 0;
  *(uint *)&p_01->pName = uVar9;
  if (uVar9 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)(int)uVar9 << 2);
  }
  p_01->pSpec = (char *)piVar7;
  *(uint *)((long)&p_01->pName + 4) = uVar1;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar1 << 2);
  }
  iVar13 = vXors->nSize;
  if (0 < iVar13) {
    piVar3 = vXors->pArray;
    uVar10 = 0;
    iVar14 = 0;
    do {
      iVar2 = piVar3[uVar10];
      if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar7[iVar2] = iVar14;
      iVar14 = iVar14 + 1;
      uVar9 = (int)uVar10 + 4;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < iVar13);
  }
  iVar13 = vCarryRoots->nSize;
  if (0 < (long)iVar13) {
    piVar3 = vCarryRoots->pArray;
    lVar15 = 0;
    do {
      uVar1 = piVar3[lVar15];
      if (((int)uVar1 < 0) || (iVar16 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      piVar6[uVar1 >> 5] = piVar6[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      lVar15 = lVar15 + 1;
    } while (iVar13 != lVar15);
  }
  if (0 < vXorRoots->nSize) {
    lVar15 = 0;
    do {
      iVar13 = vXorRoots->pArray[lVar15];
      vXorSet->nSize = 0;
      pVVar5->nSize = 0;
      Gia_ManIncrementTravId(p);
      p_02 = p;
      Acec_ManCountXorTreeInputs_rec(p,iVar13,vXors,(Vec_Int_t *)p_01,vIsCarryRoot,pVVar5,vXorSet);
      uVar1 = pVVar5->nSize;
      __nmemb = (size_t)(int)uVar1;
      uVar10 = (ulong)uVar1;
      uVar9 = 0;
      if (0 < (long)__nmemb) {
        piVar3 = pVVar5->pArray;
        uVar17 = 0;
        do {
          iVar13 = Acec_ManCheckCarryMap(p_02,piVar3[uVar17],vAdds,vCarryMap);
          uVar18 = uVar17;
          if (iVar13 != 0) break;
          uVar17 = uVar17 + 1;
          uVar18 = uVar10;
        } while (uVar10 != uVar17);
        uVar9 = (uint)uVar18;
      }
      if (uVar9 != uVar1) {
        piVar3 = pVVar5->pArray;
        qsort(piVar3,__nmemb,4,Vec_IntSortCompare1);
        pVVar8 = Vec_WecPushLevel((Vec_Wec_t *)p_00);
        iVar13 = vXorSet->nSize;
        if (0 < (long)iVar13) {
          piVar4 = vXorSet->pArray;
          lVar11 = 0;
          do {
            Vec_IntPush(pVVar8,piVar4[lVar11]);
            lVar11 = lVar11 + 1;
          } while (iVar13 != lVar11);
        }
        pVVar8 = Vec_WecPushLevel((Vec_Wec_t *)p_00);
        if (0 < (int)uVar1) {
          sVar12 = 0;
          do {
            Vec_IntPush(pVVar8,piVar3[sVar12]);
            sVar12 = sVar12 + 1;
          } while (__nmemb != sVar12);
        }
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        if (0 < (int)uVar1) {
          uVar17 = 0;
          do {
            uVar1 = piVar3[uVar17];
            if (((int)uVar1 < 0) || (iVar16 <= (int)uVar1)) goto LAB_00666903;
            if (((uint)piVar6[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) {
              __assert_fail("Vec_BitEntry(vIsCarryRoot, CarryRoot)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPool.c"
                            ,0x9b,
                            "Vec_Wec_t *Acec_ManCollectCarryRootSets(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            piVar6[uVar1 >> 5] = piVar6[uVar1 >> 5] & ~(1 << (uVar1 & 0x1f));
            uVar17 = uVar17 + 1;
          } while (uVar10 != uVar17);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < vXorRoots->nSize);
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  free(pVVar5);
  if (vXorSet->pArray != (int *)0x0) {
    free(vXorSet->pArray);
    vXorSet->pArray = (int *)0x0;
  }
  free(vXorSet);
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    p_01->pSpec = (char *)0x0;
  }
  free(p_01);
  if (0 < vCarryRoots->nSize) {
    lVar15 = 0;
    do {
      uVar1 = vCarryRoots->pArray[lVar15];
      if (((int)uVar1 < 0) || (iVar16 <= (int)uVar1)) {
LAB_00666903:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if ((((uint)piVar6[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) &&
         (iVar13 = Acec_ManCheckCarryMap(p_01,uVar1,vAdds,vCarryMap), iVar13 != 0)) {
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        pVVar5 = Vec_WecPushLevel((Vec_Wec_t *)p_00);
        if (pVVar5->nCap < 1) {
          if (pVVar5->pArray == (int *)0x0) {
            piVar7 = (int *)malloc(4);
          }
          else {
            piVar7 = (int *)realloc(pVVar5->pArray,4);
          }
          pVVar5->pArray = piVar7;
          if (piVar7 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar5->nCap = 1;
        }
        *pVVar5->pArray = uVar1;
        pVVar5->nSize = 1;
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        p_01 = p_00;
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < vCarryRoots->nSize);
  }
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    vIsCarryRoot->pArray = (int *)0x0;
  }
  free(vIsCarryRoot);
  return (Vec_Wec_t *)p_00;
}

Assistant:

Vec_Wec_t * Acec_ManCollectCarryRootSets( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vCarryMap, Vec_Int_t * vXors, Vec_Int_t * vXorRoots, Vec_Int_t * vCarryRoots )
{
    Vec_Wec_t * vCarryRootSets = Vec_WecAlloc( 100 ); // XorBoxes, CarryRoots, AdderBoxes, Ins/Ranks, Outs/Ranks
    Vec_Int_t * vCarryRootSet = Vec_IntAlloc( 100 );
    Vec_Bit_t * vIsCarryRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vXorSet = Vec_IntAlloc( 100 ), * vLevel;
    int i, k, XorRoot, CarryRoot;
    // map XORs into their cuts
    Vec_Int_t * vXorMap = Vec_IntStartFull( Gia_ManObjNum(p) );  
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        Vec_IntWriteEntry( vXorMap, Vec_IntEntry(vXors, 4*i), i );
    // create carry root marks
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, i )
        Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 1 );
    // collect carry roots attached to each XOR root
    Vec_IntForEachEntry( vXorRoots, XorRoot, i )
    {
        Vec_IntClear( vXorSet );
        Vec_IntClear( vCarryRootSet );
        Gia_ManIncrementTravId( p );
        Acec_ManCountXorTreeInputs_rec( p, XorRoot, vXors, vXorMap, vIsCarryRoot, vCarryRootSet, vXorSet );
        // skip trivial
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
            if ( Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
                break;
        if ( k == Vec_IntSize(vCarryRootSet) )
            continue;
        Vec_IntSort( vCarryRootSet, 0 );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vXorSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vCarryRootSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        // unmark carry root set
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
        {
            assert( Vec_BitEntry(vIsCarryRoot, CarryRoot) );
            Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 0 );
        }
    }
    Vec_IntFree( vCarryRootSet );
    Vec_IntFree( vXorSet );
    Vec_IntFree( vXorMap );
    // collect unmarked carry roots
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, k )
    {
        if ( !Vec_BitEntry(vIsCarryRoot, CarryRoot) )
            continue;
        if ( !Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
            continue;
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntFill( vLevel, 1, CarryRoot );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
    }
    Vec_BitFree( vIsCarryRoot );
    return vCarryRootSets;
}